

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinimizerParameters.cpp
# Opt level: O2

void __thiscall OpenMD::MinimizerParameters::~MinimizerParameters(MinimizerParameters *this)

{
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__MinimizerParameters_002bec58;
  ParameterBase::~ParameterBase(&(this->InitialStepSize).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->GradientNormEpsilon).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->FunctionEpsilon).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->RootEpsilon).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->MaxStationaryStateIterations).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->MaxIterations).super_ParameterBase);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter(&this->Method);
  ParameterBase::~ParameterBase(&(this->UseMinimizer).super_ParameterBase);
  DataHolder::~DataHolder(&this->super_DataHolder);
  return;
}

Assistant:

void MinimizerParameters::validate() {
    CheckParameter(Method, isEqualIgnoreCase("SD") || isEqualIgnoreCase("CG") ||
                               isEqualIgnoreCase("BFGS"));
    CheckParameter(MaxIterations, isPositive());
    int one       = 1;
    int mi        = this->getMaxIterations();
    RealType zero = 0.0;
    RealType oneR = 1.0;
    CheckParameter(MaxStationaryStateIterations,
                   isGreaterThanOrEqualTo(one) && isLessThanOrEqualTo(mi));
    CheckParameter(RootEpsilon, isPositive());
    CheckParameter(GradientNormEpsilon, isPositive());
    CheckParameter(InitialStepSize,
                   isGreaterThan(zero) && isLessThanOrEqualTo(oneR));
  }